

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O0

void read_register(rtc_t *rtc)

{
  byte bVar1;
  long in_RDI;
  tm *timeinfo_1;
  time_t rawtime_1;
  tm *timeinfo;
  time_t rawtime;
  time_t local_20;
  tm *local_18;
  time_t local_10;
  long local_8;
  
  local_8 = in_RDI;
  switch(*(undefined1 *)(in_RDI + 0x20)) {
  case 0:
    printf("RESET\n");
    *(undefined8 *)(local_8 + 0x10) = 0;
    *(undefined1 *)(local_8 + 0x21) = 0;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
            0x58);
    fprintf(_stderr,"Reading unknown register: 0x%X\n\x1b[0;m",(ulong)*(byte *)(local_8 + 0x20));
    exit(1);
  case 2:
    time(&local_10);
    local_18 = localtime(&local_10);
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1;
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    printf("DATETIME_REG: 0x%012lX\n",*(undefined8 *)(local_8 + 0x10));
    break;
  case 4:
    *(ulong *)(in_RDI + 0x10) = (ulong)*(byte *)(in_RDI + 0x21);
    *(byte *)(in_RDI + 0x21) = *(byte *)(in_RDI + 0x21) & 0x7f;
    printf("CONTROL_REG: 0x%02lX\n",*(undefined8 *)(in_RDI + 0x10));
    break;
  case 6:
    time(&local_20);
    localtime(&local_20);
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1;
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) << 8;
    bVar1 = to_bcd('\0');
    *(ulong *)(local_8 + 0x10) = (ulong)bVar1 | *(ulong *)(local_8 + 0x10);
    printf("TIME_REG: 0x%lX\n",*(undefined8 *)(local_8 + 0x10));
  }
  return;
}

Assistant:

void read_register(rtc_t* rtc) {
    switch (rtc->reg) {
        case RESET_REG:
            printf("RESET\n");
            rtc->buffer = 0;
            rtc->control_reg.raw = 0;
            break;
        case DATETIME_REG: {
            time_t rawtime;
            struct tm *timeinfo;
            time(&rawtime);
            timeinfo = localtime(&rawtime);

            rtc->buffer = to_bcd(timeinfo->tm_sec);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_min);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_hour);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_wday);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_mday);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_mon + 1);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_year - 100);
            printf("DATETIME_REG: 0x%012lX\n", rtc->buffer);
            break;
        }
        case CONTROL_REG:
            rtc->buffer = rtc->control_reg.raw;
            rtc->control_reg.poweroff = 0;
            printf("CONTROL_REG: 0x%02lX\n", rtc->buffer);
            break;
        case TIME_REG: {
            time_t rawtime;
            struct tm *timeinfo;
            time(&rawtime);
            timeinfo = localtime(&rawtime);

            rtc->buffer = to_bcd(timeinfo->tm_sec);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_min);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_hour);

            printf("TIME_REG: 0x%lX\n", rtc->buffer);
            break;
        }
        default:
            logfatal("Reading unknown register: 0x%X", rtc->reg)
    }

}